

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,__1>_>
          *op)

{
  bool cond;
  printer *ppVar1;
  double local_38;
  double local_30;
  string_view local_28;
  eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,__1>_>
  *local_18;
  eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,__1>_>
  *op_local;
  printer *this_local;
  
  local_18 = op;
  op_local = (eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,__1>_>
              *)this;
  cond = detail::eq_::operator_cast_to_bool((eq_ *)op);
  local_28 = color(this,cond);
  ppVar1 = operator<<(this,&local_28);
  local_30 = detail::
             eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,_-1>_>
             ::lhs(local_18);
  ppVar1 = operator<<(ppVar1,&local_30);
  ppVar1 = operator<<(ppVar1,(char (*) [5])" == ");
  local_38 = detail::
             eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,_-1>_>
             ::rhs(local_18);
  ppVar1 = operator<<(ppVar1,&local_38);
  ppVar1 = operator<<(ppVar1,(basic_string_view<char,_std::char_traits<char>_> *)this);
  return ppVar1;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }